

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMig.h
# Opt level: O2

void Mig_ObjSetFaninLit(Mig_Obj_t *p,int i,int l)

{
  int v;
  uint uVar1;
  
  if ((-1 < l) && ((uint)l >> 1 < (uint)p->pFans[3] >> 1)) {
    v = Abc_Lit2Var(l);
    Mig_FanSetId(p,i,v);
    uVar1 = Abc_LitIsCompl(l);
    p->pFans[(uint)i] = (Mig_Fan_t)((uint)p->pFans[(uint)i] & 0xfffffffe | uVar1);
    return;
  }
  __assert_fail("l >= 0 && (l >> 1) < Mig_ObjId(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMig.h"
                ,0xba,"void Mig_ObjSetFaninLit(Mig_Obj_t *, int, int)");
}

Assistant:

static inline void         Mig_ObjSetFaninLit( Mig_Obj_t * p, int i, int l )   { assert( l >= 0 && (l >> 1) < Mig_ObjId(p) ); Mig_FanSetId(p, i, Abc_Lit2Var(l)); Mig_FanSetCompl(p, i, Abc_LitIsCompl(l));       }